

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Obj_t * Abc_NodeRecognizeMux(Abc_Obj_t *pNode,Abc_Obj_t **ppNodeT,Abc_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  long *plVar4;
  long *plVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x57c,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)")
    ;
  }
  iVar7 = Abc_NodeIsMuxType(pNode);
  if (iVar7 == 0) {
    __assert_fail("Abc_NodeIsMuxType(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x57d,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)")
    ;
  }
  piVar9 = (pNode->vFanins).pArray;
  ppvVar3 = pNode->pNtk->vObjs->pArray;
  plVar4 = (long *)ppvVar3[*piVar9];
  plVar5 = (long *)ppvVar3[piVar9[1]];
  piVar9 = (int *)plVar4[4];
  iVar7 = *piVar9;
  piVar6 = (int *)plVar5[4];
  iVar1 = *piVar6;
  if (iVar7 == iVar1) {
    uVar11 = *(uint *)((long)plVar4 + 0x14) >> 10 & 1;
    if (uVar11 == ((*(uint *)((long)plVar5 + 0x14) >> 10 & 1) != 0)) goto LAB_001fae8e;
    if (uVar11 == 0) {
      *ppNodeT = (Abc_Obj_t *)
                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 0xb & 1) ^
                  *(ulong *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)piVar9[1] * 8) ^ 1);
      iVar7 = *(int *)(plVar5[4] + 4);
      lVar10 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
      uVar11 = *(uint *)((long)plVar5 + 0x14) >> 0xb;
LAB_001fb025:
      *ppNodeE = (Abc_Obj_t *)((ulong)(uVar11 & 1) ^ *(ulong *)(lVar10 + (long)iVar7 * 8) ^ 1);
      lVar10 = *plVar4;
      piVar9 = (int *)plVar4[4];
    }
    else {
      *ppNodeT = (Abc_Obj_t *)
                 ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) ^
                  *(ulong *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)piVar6[1] * 8) ^ 1);
      iVar7 = *(int *)(plVar4[4] + 4);
      lVar10 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
      uVar11 = *(uint *)((long)plVar4 + 0x14) >> 0xb;
LAB_001fb178:
      *ppNodeE = (Abc_Obj_t *)((ulong)(uVar11 & 1) ^ *(ulong *)(lVar10 + (long)iVar7 * 8) ^ 1);
      lVar10 = *plVar5;
      piVar9 = (int *)plVar5[4];
      plVar4 = plVar5;
    }
    iVar7 = 10;
    goto LAB_001fb196;
  }
LAB_001fae8e:
  iVar2 = piVar6[1];
  if (iVar7 == iVar2) {
    uVar11 = *(uint *)((long)plVar4 + 0x14) >> 10 & 1;
    if (uVar11 == ((*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) != 0)) goto LAB_001faebb;
    if (uVar11 == 0) {
      *ppNodeT = (Abc_Obj_t *)
                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 0xb & 1) ^
                  *(ulong *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)piVar9[1] * 8) ^ 1);
      iVar7 = *(int *)plVar5[4];
      lVar10 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
      uVar11 = *(uint *)((long)plVar5 + 0x14) >> 10;
      goto LAB_001fb025;
    }
    *ppNodeT = (Abc_Obj_t *)
               ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                *(ulong *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)iVar1 * 8) ^ 1);
    iVar7 = *(int *)(plVar4[4] + 4);
    lVar10 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
    uVar11 = *(uint *)((long)plVar4 + 0x14) >> 0xb;
LAB_001fb116:
    *ppNodeE = (Abc_Obj_t *)((ulong)(uVar11 & 1) ^ *(ulong *)(lVar10 + (long)iVar7 * 8) ^ 1);
    lVar10 = *plVar5;
    lVar8 = plVar5[4];
  }
  else {
LAB_001faebb:
    if (piVar9[1] == iVar1) {
      uVar11 = *(uint *)((long)plVar4 + 0x14) >> 0xb & 1;
      if (uVar11 == ((*(uint *)((long)plVar5 + 0x14) >> 10 & 1) != 0)) goto LAB_001faee7;
      if (uVar11 != 0) {
        *ppNodeT = (Abc_Obj_t *)
                   ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) ^
                    *(ulong *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)iVar2 * 8) ^ 1);
        iVar7 = *(int *)plVar4[4];
        lVar10 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        uVar11 = *(uint *)((long)plVar4 + 0x14) >> 10;
        goto LAB_001fb178;
      }
      *ppNodeT = (Abc_Obj_t *)
                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                  *(ulong *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)iVar7 * 8) ^ 1);
      iVar7 = *(int *)(plVar5[4] + 4);
      lVar10 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
      uVar11 = *(uint *)((long)plVar5 + 0x14) >> 0xb;
    }
    else {
LAB_001faee7:
      if (piVar9[1] != iVar2) {
LAB_001fb1f7:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                      ,0x5c6,
                      "Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)");
      }
      uVar11 = *(uint *)((long)plVar4 + 0x14) >> 0xb & 1;
      if (uVar11 == ((*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) != 0)) goto LAB_001fb1f7;
      if (uVar11 != 0) {
        *ppNodeT = (Abc_Obj_t *)
                   ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                    *(ulong *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)iVar1 * 8) ^ 1);
        iVar7 = *(int *)plVar4[4];
        lVar10 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        uVar11 = *(uint *)((long)plVar4 + 0x14) >> 10;
        goto LAB_001fb116;
      }
      *ppNodeT = (Abc_Obj_t *)
                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                  *(ulong *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)iVar7 * 8) ^ 1);
      iVar7 = *(int *)plVar5[4];
      lVar10 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
      uVar11 = *(uint *)((long)plVar5 + 0x14) >> 10;
    }
    *ppNodeE = (Abc_Obj_t *)((ulong)(uVar11 & 1) ^ *(ulong *)(lVar10 + (long)iVar7 * 8) ^ 1);
    lVar10 = *plVar4;
    lVar8 = plVar4[4];
    plVar5 = plVar4;
  }
  piVar9 = (int *)(lVar8 + 4);
  iVar7 = 0xb;
  plVar4 = plVar5;
LAB_001fb196:
  return (Abc_Obj_t *)
         ((ulong)((*(uint *)((long)plVar4 + 0x14) >> iVar7 & 1) != 0) ^
         *(ulong *)(*(long *)(*(long *)(lVar10 + 0x20) + 8) + (long)*piVar9 * 8));
}

Assistant:

Abc_Obj_t * Abc_NodeRecognizeMux( Abc_Obj_t * pNode, Abc_Obj_t ** ppNodeT, Abc_Obj_t ** ppNodeE )
{
    Abc_Obj_t * pNode0, * pNode1;
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_NodeIsMuxType(pNode) );
    // get children
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    // find the control variable
//    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    if ( Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Abc_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            return Abc_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            return Abc_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    else if ( Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Abc_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            return Abc_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            return Abc_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    else if ( Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Abc_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            return Abc_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            return Abc_ObjChild1(pNode0);//pNode1->p2;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    else if ( Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Abc_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            return Abc_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            return Abc_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}